

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsio.c
# Opt level: O3

void wsio_destroy_option(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  
  if (name == (char *)0x0 || value == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar3 = "Bad arguments: const char* name=%p, const void* value=%p";
    iVar1 = 0x2eb;
  }
  else {
    iVar1 = strcmp(name,"WSIOOptions");
    if (iVar1 == 0) {
      OptionHandler_Destroy((OPTIONHANDLER_HANDLE)value);
      return;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar3 = "unknown option: %s";
    iVar1 = 0x2f7;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
            ,"wsio_destroy_option",iVar1,1,pcVar3,name);
  return;
}

Assistant:

static void wsio_destroy_option(const char* name, const void* value)
{
    if (
        (name == NULL) ||
        (value == NULL)
        )
    {
        /* Codes_SRS_WSIO_01_177: [ If wsio_destroy_option is called with NULL name or value it shall do nothing. ]*/
        LogError("Bad arguments: const char* name=%p, const void* value=%p", name, value);
    }
    else
    {
        if (strcmp(name, WSIO_OPTIONS) == 0)
        {
            /* Codes_SRS_WSIO_01_175: [ wsio_destroy_option called with the option name being WSIOOptions shall destroy the value by calling OptionHandler_Destroy. ]*/
            OptionHandler_Destroy((OPTIONHANDLER_HANDLE)value);
        }
        else
        {
            /* Codes_SRS_WSIO_01_176: [ If wsio_destroy_option is called with any other name it shall do nothing. ]*/
            LogError("unknown option: %s", name);
        }
    }
}